

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_genn.cc
# Opt level: O0

int GENERAL_NAME_cmp(GENERAL_NAME *a,GENERAL_NAME *b)

{
  GENERAL_NAME *b_local;
  GENERAL_NAME *a_local;
  
  if (((a == (GENERAL_NAME *)0x0) || (b == (GENERAL_NAME *)0x0)) || (a->type != b->type)) {
    a_local._4_4_ = -1;
  }
  else {
    switch(a->type) {
    case 0:
      a_local._4_4_ = othername_cmp((OTHERNAME *)(a->d).otherName,(OTHERNAME *)(b->d).otherName);
      break;
    case 1:
    case 2:
    case 6:
      a_local._4_4_ =
           ASN1_STRING_cmp((ASN1_STRING *)(a->d).otherName,(ASN1_STRING *)(b->d).otherName);
      break;
    case 3:
      a_local._4_4_ =
           ASN1_STRING_cmp((ASN1_STRING *)(a->d).otherName,(ASN1_STRING *)(b->d).otherName);
      break;
    case 4:
      a_local._4_4_ = X509_NAME_cmp((a->d).directoryName,(b->d).directoryName);
      break;
    case 5:
      a_local._4_4_ =
           edipartyname_cmp((EDIPARTYNAME *)(a->d).otherName,(EDIPARTYNAME *)(b->d).otherName);
      break;
    case 7:
      a_local._4_4_ = ASN1_OCTET_STRING_cmp((a->d).iPAddress,(b->d).iPAddress);
      break;
    case 8:
      a_local._4_4_ = OBJ_cmp((a->d).registeredID,(b->d).registeredID);
      break;
    default:
      a_local._4_4_ = -1;
    }
  }
  return a_local._4_4_;
}

Assistant:

int GENERAL_NAME_cmp(const GENERAL_NAME *a, const GENERAL_NAME *b) {
  if (!a || !b || a->type != b->type) {
    return -1;
  }

  switch (a->type) {
    case GEN_X400:
      return ASN1_STRING_cmp(a->d.x400Address, b->d.x400Address);

    case GEN_EDIPARTY:
      return edipartyname_cmp(a->d.ediPartyName, b->d.ediPartyName);

    case GEN_OTHERNAME:
      return othername_cmp(a->d.otherName, b->d.otherName);

    case GEN_EMAIL:
    case GEN_DNS:
    case GEN_URI:
      return ASN1_STRING_cmp(a->d.ia5, b->d.ia5);

    case GEN_DIRNAME:
      return X509_NAME_cmp(a->d.dirn, b->d.dirn);

    case GEN_IPADD:
      return ASN1_OCTET_STRING_cmp(a->d.ip, b->d.ip);

    case GEN_RID:
      return OBJ_cmp(a->d.rid, b->d.rid);
  }

  return -1;
}